

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.c
# Opt level: O0

void obj_merge_light_sources(obj *src,obj *dest)

{
  int iVar1;
  ls_t *local_20;
  light_source *ls;
  obj *dest_local;
  obj *src_local;
  
  if (src != dest) {
    end_burn(src,'\x01');
  }
  local_20 = level->lev_lights;
  while( true ) {
    if (local_20 == (ls_t *)0x0) {
      return;
    }
    if ((local_20->type == 0) && ((obj *)local_20->id == dest)) break;
    local_20 = local_20->next;
  }
  iVar1 = candle_light_range(dest);
  local_20->range = (short)iVar1;
  vision_full_recalc = '\x01';
  return;
}

Assistant:

void obj_merge_light_sources(struct obj *src, struct obj *dest)
{
    light_source *ls;

    /* src == dest implies adding to candelabrum */
    if (src != dest) end_burn(src, TRUE);		/* extinguish candles */

    for (ls = level->lev_lights; ls; ls = ls->next)
	if (ls->type == LS_OBJECT && ls->id == dest) {
	    ls->range = candle_light_range(dest);
	    vision_full_recalc = 1;	/* in case range changed */
	    break;
	}
}